

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

QMap<int,_QVariant> __thiscall QTableModel::itemData(QTableModel *this,QModelIndex *index)

{
  QTableWidgetItem *pQVar1;
  int *key;
  qsizetype qVar2;
  QTableModel *in_RDI;
  int i;
  QTableWidgetItem *itm;
  QMap<int,_QVariant> *roles;
  qsizetype in_stack_ffffffffffffff98;
  const_reference in_stack_ffffffffffffffa0;
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
  this_00;
  int local_2c;
  
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  this_00.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_*>
        )(totally_ordered_wrapper<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_*>
          )in_RDI;
  QMap<int,_QVariant>::QMap((QMap<int,_QVariant> *)0x8d6092);
  pQVar1 = item((QTableModel *)this_00.d.ptr,(QModelIndex *)in_RDI);
  if (pQVar1 != (QTableWidgetItem *)0x0) {
    local_2c = 0;
    while( true ) {
      key = (int *)(long)local_2c;
      qVar2 = QList<QWidgetItemData>::size(&pQVar1->values);
      if (qVar2 <= (long)key) break;
      in_stack_ffffffffffffffa0 =
           QList<QWidgetItemData>::at
                     ((QList<QWidgetItemData> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98)
      ;
      QList<QWidgetItemData>::at
                ((QList<QWidgetItemData> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      QMap<int,_QVariant>::insert
                ((QMap<int,_QVariant> *)in_RDI,key,(QVariant *)in_stack_ffffffffffffffa0);
      local_2c = local_2c + 1;
    }
  }
  return (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
          )(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
            )this_00.d.ptr;
}

Assistant:

QMap<int, QVariant> QTableModel::itemData(const QModelIndex &index) const
{
    QMap<int, QVariant> roles;
    QTableWidgetItem *itm = item(index);
    if (itm) {
        for (int i = 0; i < itm->values.size(); ++i) {
            roles.insert(itm->values.at(i).role,
                         itm->values.at(i).value);
        }
    }
    return roles;
}